

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwJoystickIsGamepad(int jid)

{
  int iVar1;
  uint in_EDI;
  _GLFWjoystick *unaff_retaddr;
  _GLFWjoystick *js;
  int in_stack_fffffffffffffffc;
  uint uVar2;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    uVar2 = 0;
  }
  else if (((int)in_EDI < 0) || (0xf < (int)in_EDI)) {
    _glfwInputError(0x10003,"Invalid joystick ID %i",(ulong)in_EDI);
    uVar2 = 0;
  }
  else if (_glfw.joysticks[(int)in_EDI].present == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = _glfwPlatformPollJoystick(unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)(_glfw.joysticks[(int)in_EDI].mapping != (_GLFWmapping *)0x0);
    }
  }
  return uVar2;
}

Assistant:

GLFWAPI int glfwJoystickIsGamepad(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return GLFW_FALSE;

    return js->mapping != NULL;
}